

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_1f29eed::SatdTest_Match_Test::TestBody(SatdTest_Match_Test *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *message;
  internal in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  int total_simd;
  int total_ref;
  RegisterStateCheckMMX reg_check_mmx;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  AssertHelper local_38;
  int local_30;
  int local_2c;
  RegisterStateCheckMMX local_28;
  
  local_28.pre_fpu_env_[0]._0_1_ = in_FPUControlWord;
  SatdTestBase<int,_int_(*)(const_int_*,_int)>::FillRandom
            ((SatdTestBase<int,_int_(*)(const_int_*,_int)> *)this);
  local_28.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
  local_28.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  local_2c = (*(this->super_SatdTest).super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.
               satd_func_ref_)((this->super_SatdTest).
                               super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.src_,
                               (this->super_SatdTest).
                               super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.satd_size_);
  libaom_test::RegisterStateCheckMMX::Check(&local_28);
  local_28.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
  local_28.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  local_28.pre_fpu_env_[4] = in_FPUTagWord;
  local_30 = (*(this->super_SatdTest).super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.
               satd_func_simd_)((this->super_SatdTest).
                                super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.src_,
                                (this->super_SatdTest).
                                super_SatdTestBase<int,_int_(*)(const_int_*,_int)>.satd_size_);
  libaom_test::RegisterStateCheckMMX::Check(&local_28);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_28,"total_ref","total_simd",&local_2c,&local_30);
  if (local_28.pre_fpu_env_[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    puVar1 = (undefined8 *)
             CONCAT44(local_28.pre_fpu_env_._12_4_,
                      CONCAT22(local_28.pre_fpu_env_[5],local_28.pre_fpu_env_[4]));
    if (puVar1 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*puVar1;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x396,(char *)message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_40._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  puVar1 = (undefined8 *)
           CONCAT44(local_28.pre_fpu_env_._12_4_,
                    CONCAT22(local_28.pre_fpu_env_[5],local_28.pre_fpu_env_[4]));
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  return;
}

Assistant:

TEST_P(SatdTest, Match) {
  FillRandom();
  RunComparison();
}